

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

void si9ma::BinaryTree::print_in_order(TreeNode *head,int height,int len,string *to)

{
  TreeNode *pTVar1;
  int len_00;
  int height_00;
  ostream *this;
  int num;
  int num_00;
  undefined1 auVar2 [12];
  allocator local_1b1;
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [40];
  long len_r;
  long len_l;
  long len_m;
  undefined1 local_98 [32];
  undefined1 local_78 [8];
  string val;
  undefined1 local_40 [40];
  string *to_local;
  int len_local;
  int height_local;
  TreeNode *head_local;
  
  if (head != (TreeNode *)0x0) {
    pTVar1 = head->right;
    local_40._32_8_ = to;
    to_local._0_4_ = len;
    to_local._4_4_ = height;
    _len_local = head;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_40,"v",
               (allocator *)
               (val.
                super__Hash_node_value<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                .
                super__Hash_node_value_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_storage._M_storage.__data + 0x27));
    print_in_order(pTVar1,height + 1,len,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               (val.
                super__Hash_node_value<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                .
                super__Hash_node_value_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_storage._M_storage.__data + 0x27));
    std::__cxx11::to_string((string *)&len_m,_len_local->value);
    std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_98,to,(string *)&len_m);
    std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_78,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_98,to);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&len_m);
    auVar2 = std::__cxx11::string::length();
    len_l = auVar2._0_8_;
    len_r = ((int)to_local - len_l) / 2;
    local_f0._32_8_ = ((int)to_local - len_l) - len_r;
    get_space_abi_cxx11_((string *)local_130,(BinaryTree *)(len_r & 0xffffffff),auVar2._8_4_);
    std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_110,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_130,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_78);
    get_space_abi_cxx11_((string *)local_150,(BinaryTree *)(local_f0._32_8_ & 0xffffffff),num);
    std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_f0,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_110,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_150);
    std::__cxx11::string::operator=((string *)local_78,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_130);
    get_space_abi_cxx11_
              ((string *)local_190,(BinaryTree *)(ulong)(uint)(to_local._4_4_ * (int)to_local),
               num_00);
    std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_170,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_190,
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_78);
    this = std::operator<<((ostream *)&std::cout,(string *)local_170);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_190);
    len_00 = (int)to_local;
    pTVar1 = _len_local->left;
    height_00 = to_local._4_4_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1b0,"^",&local_1b1);
    print_in_order(pTVar1,height_00,len_00,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void BinaryTree::print_in_order(const TreeNode *head, int height, int len, string to) {
        if (head == nullptr)
            return;

        print_in_order(head->right,height + 1,len,"v");
        string val = to + to_string(head->value) + to;
        long len_m = val.length();
        long len_l = (len - len_m) / 2;
        long len_r = len - len_m - len_l;
        val = get_space(len_l) + val + get_space(len_r);
        cout << get_space(height * len) + val << endl;
        print_in_order(head->left,height + 1,len,"^");
    }